

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_list::erase_peer(peer_list *this,torrent_peer *p,torrent_state *state)

{
  _Self *p_Var1;
  _Self *p_Var2;
  _Self *p_Var3;
  bool bVar4;
  difference_type dVar5;
  long lVar6;
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  _Self local_228;
  torrent_peer **local_200;
  _Self local_1f8;
  peer_list *local_1d0;
  torrent_state *local_1c8;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_1c0;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_1a0;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_180;
  torrent_peer *local_160;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_158;
  _Elt_pointer local_138;
  _Elt_pointer pptStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  _Elt_pointer local_118;
  _Elt_pointer pptStack_110;
  _Elt_pointer local_108;
  _Map_pointer ppptStack_100;
  _Elt_pointer local_f8;
  _Elt_pointer pptStack_f0;
  _Elt_pointer local_e8;
  _Map_pointer ppptStack_e0;
  _Elt_pointer local_d8;
  _Elt_pointer pptStack_d0;
  _Elt_pointer local_c8;
  _Map_pointer ppptStack_c0;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_b8;
  iterator local_90;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_70;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_50;
  
  local_118 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptStack_110 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_108 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppptStack_100 =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_138 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptStack_130 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_128 = *(undefined4 *)
               &(this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last;
  uStack_124 = *(undefined4 *)
                ((long)&(this->m_peers).
                        super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        .
                        super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
  uStack_120 = *(undefined4 *)
                &(this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uStack_11c = *(undefined4 *)
                ((long)&(this->m_peers).
                        super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        .
                        super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
  local_1d0 = this;
  local_1c8 = state;
  local_160 = p;
  ::std::
  equal_range<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,libtorrent::aux::torrent_peer*,libtorrent::aux::peer_address_compare>
            (&local_f8,&local_118,&local_138,&local_160);
  local_228._M_cur = local_f8;
  local_228._M_first = pptStack_f0;
  local_228._M_last = local_e8;
  local_228._M_node = ppptStack_e0;
  local_1f8._M_cur = local_d8;
  local_1f8._M_first = pptStack_d0;
  local_1f8._M_last = local_c8;
  local_1f8._M_node = ppptStack_c0;
  local_200 = &local_160;
  dVar5 = ::std::operator-(&local_1f8,&local_228);
  for (lVar6 = dVar5 >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
    local_158._M_cur = local_228._M_cur;
    local_158._M_first = local_228._M_first;
    local_158._M_last = local_228._M_last;
    local_158._M_node = local_228._M_node;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::__0>
                          *)&local_200,&local_158);
    if (bVar4) goto LAB_00258d30;
    local_228._M_cur = local_228._M_cur + 1;
    if (local_228._M_cur == local_228._M_last) {
      local_228._M_cur = local_228._M_node[1];
      local_228._M_last = local_228._M_cur + 0x40;
      local_228._M_first = local_228._M_cur;
      local_228._M_node = local_228._M_node + 1;
    }
    local_180._M_cur = local_228._M_cur;
    local_180._M_first = local_228._M_first;
    local_180._M_last = local_228._M_last;
    local_180._M_node = local_228._M_node;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::__0>
                          *)&local_200,&local_180);
    if (bVar4) goto LAB_00258d30;
    local_228._M_cur = local_228._M_cur + 1;
    if (local_228._M_cur == local_228._M_last) {
      local_228._M_cur = local_228._M_node[1];
      local_228._M_last = local_228._M_cur + 0x40;
      local_228._M_first = local_228._M_cur;
      local_228._M_node = local_228._M_node + 1;
    }
    local_1a0._M_cur = local_228._M_cur;
    local_1a0._M_first = local_228._M_first;
    local_1a0._M_last = local_228._M_last;
    local_1a0._M_node = local_228._M_node;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::__0>
                          *)&local_200,&local_1a0);
    if (bVar4) goto LAB_00258d30;
    local_228._M_cur = local_228._M_cur + 1;
    if (local_228._M_cur == local_228._M_last) {
      local_228._M_cur = local_228._M_node[1];
      local_228._M_last = local_228._M_cur + 0x40;
      local_228._M_first = local_228._M_cur;
      local_228._M_node = local_228._M_node + 1;
    }
    local_1c0._M_cur = local_228._M_cur;
    local_1c0._M_first = local_228._M_first;
    local_1c0._M_last = local_228._M_last;
    local_1c0._M_node = local_228._M_node;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::__0>
                          *)&local_200,&local_1c0);
    if (bVar4) goto LAB_00258d30;
    local_228._M_cur = local_228._M_cur + 1;
    if (local_228._M_cur == local_228._M_last) {
      local_228._M_cur = local_228._M_node[1];
      local_228._M_last = local_228._M_cur + 0x40;
      local_228._M_first = local_228._M_cur;
      local_228._M_node = local_228._M_node + 1;
    }
  }
  dVar5 = ::std::operator-(&local_1f8,&local_228);
  if (dVar5 == 3) {
    local_b8._M_cur = local_228._M_cur;
    local_b8._M_first = local_228._M_first;
    local_b8._M_last = local_228._M_last;
    local_b8._M_node = local_228._M_node;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::__0>
                          *)&local_200,&local_b8);
    if (!bVar4) {
      local_228._M_cur = local_228._M_cur + 1;
      if (local_228._M_cur == local_228._M_last) {
        local_228._M_cur = local_228._M_node[1];
        local_228._M_last = local_228._M_cur + 0x40;
        local_228._M_first = local_228._M_cur;
        local_228._M_node = local_228._M_node + 1;
      }
      goto LAB_00258c98;
    }
  }
  else {
    if (dVar5 != 2) {
      if (dVar5 == 1) goto LAB_00258d02;
LAB_00258d9b:
      p_Var1 = &local_1f8;
      p_Var2 = &local_1f8;
      p_Var3 = &local_1f8;
      local_90._M_cur = local_1f8._M_cur;
      goto LAB_00258d3f;
    }
LAB_00258c98:
    local_50._M_first = local_228._M_first;
    local_50._M_cur = local_228._M_cur;
    local_50._M_last = local_228._M_last;
    local_50._M_node = local_228._M_node;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::__0>
                          *)&local_200,&local_50);
    if (!bVar4) {
      local_228._M_cur = local_228._M_cur + 1;
      if (local_228._M_cur == local_228._M_last) {
        local_228._M_cur = local_228._M_node[1];
        local_228._M_last = local_228._M_cur + 0x40;
        local_228._M_first = local_228._M_cur;
        local_228._M_node = local_228._M_node + 1;
      }
LAB_00258d02:
      local_70._M_first = local_228._M_first;
      local_70._M_cur = local_228._M_cur;
      local_70._M_last = local_228._M_last;
      local_70._M_node = local_228._M_node;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::$_0>
              ::operator()((_Iter_pred<libtorrent::aux::peer_list::erase_peer(libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_state*)::__0>
                            *)&local_200,&local_70);
      if (!bVar4) {
        if (local_228._M_cur + 1 == local_228._M_last) {
          local_228._M_node = local_228._M_node + 1;
        }
        goto LAB_00258d9b;
      }
    }
  }
LAB_00258d30:
  p_Var1 = &local_228;
  p_Var2 = &local_228;
  p_Var3 = &local_228;
  local_90._M_cur = local_228._M_cur;
LAB_00258d3f:
  if (local_90._M_cur != local_d8) {
    local_90._M_first = p_Var1->_M_first;
    local_90._M_last = p_Var2->_M_last;
    local_90._M_node = p_Var3->_M_node;
    erase_peer(local_1d0,&local_90,local_1c8);
  }
  return;
}

Assistant:

void peer_list::erase_peer(torrent_peer* p, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		TORRENT_ASSERT(p->in_use);
		TORRENT_ASSERT(m_locked_peer != p);

		auto const range = std::equal_range(m_peers.begin(), m_peers.end(), p, peer_address_compare{});
		auto const iter = std::find_if(range.first, range.second, [&](torrent_peer const* needle) {
			return torrent_peer_equal(needle, p);
		});
		if (iter == range.second) return;
		erase_peer(iter, state);
	}